

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_size(BUFFER_HANDLE handle,size_t *size)

{
  BUFFER *b;
  int result;
  size_t *size_local;
  BUFFER_HANDLE handle_local;
  
  if ((handle == (BUFFER_HANDLE)0x0) || (size == (size_t *)0x0)) {
    b._4_4_ = 0x1c9;
  }
  else {
    *size = handle->size;
    b._4_4_ = 0;
  }
  return b._4_4_;
}

Assistant:

int BUFFER_size(BUFFER_HANDLE handle, size_t* size)
{
    int result;
    if ((handle == NULL) || (size == NULL))
    {
        /* Codes_SRS_BUFFER_07_022: [BUFFER_size shall return a nonzero value for any error that is encountered.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        *size = b->size;
        result = 0;
    }
    return result;
}